

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     IntersectFrames<duckdb::ModeFunction<duckdb::ModeStandard<duckdb::interval_t>>::UpdateWindowState<duckdb::ModeState<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>,duckdb::interval_t>>
               (SubFrames *lefts,SubFrames *rights,
               UpdateWindowState<duckdb::ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>,_duckdb::interval_t>
               *op)

{
  unsigned_long uVar1;
  const_reference pvVar2;
  size_type sVar3;
  UpdateWindowState<duckdb::ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>,_duckdb::interval_t>
  *in_RDX;
  vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *in_RSI;
  vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *in_RDI;
  unsigned_long limit;
  FrameBounds *right;
  FrameBounds *left;
  uint8_t overlap;
  unsigned_long i;
  idx_t r;
  idx_t l;
  FrameBounds last;
  unsigned_long cover_end;
  unsigned_long cover_start;
  ulong in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  ulong begin;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  idx_t local_70;
  const_reference local_68;
  vector<duckdb::FrameBounds,_true> *in_stack_ffffffffffffffa0;
  bool local_51;
  unsigned_long local_50;
  ulong local_48;
  ulong local_40;
  FrameBounds local_38;
  unsigned_long local_28;
  unsigned_long local_20;
  UpdateWindowState<duckdb::ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>,_duckdb::interval_t>
  *local_18;
  vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *local_10;
  vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pvVar2 = vector<duckdb::FrameBounds,_true>::operator[]
                     ((vector<duckdb::FrameBounds,_true> *)
                      CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff58);
  uVar1 = pvVar2->start;
  pvVar2 = vector<duckdb::FrameBounds,_true>::operator[]
                     ((vector<duckdb::FrameBounds,_true> *)
                      CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff58);
  local_20 = MinValue<unsigned_long>(uVar1,pvVar2->start);
  pvVar2 = vector<duckdb::FrameBounds,_true>::back(in_stack_ffffffffffffffa0);
  uVar1 = pvVar2->end;
  pvVar2 = vector<duckdb::FrameBounds,_true>::back(in_stack_ffffffffffffffa0);
  local_28 = MaxValue<unsigned_long>(uVar1,pvVar2->end);
  FrameBounds::FrameBounds(&local_38,local_28,local_28);
  local_40 = 0;
  local_48 = 0;
  local_50 = local_20;
  do {
    if (local_28 <= local_50) {
      return;
    }
    local_51 = false;
    pvVar2 = &local_38;
    sVar3 = std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::size(local_8);
    if (local_40 < sVar3) {
      pvVar2 = vector<duckdb::FrameBounds,_true>::operator[]
                         ((vector<duckdb::FrameBounds,_true> *)
                          CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff58);
      in_stack_ffffffffffffff77 = false;
      local_51 = (bool)in_stack_ffffffffffffff77;
      if (pvVar2->start <= local_50) {
        in_stack_ffffffffffffff77 = local_50 < pvVar2->end;
        local_51 = (bool)in_stack_ffffffffffffff77;
      }
    }
    local_68 = &local_38;
    begin = local_48;
    sVar3 = std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::size(local_10);
    if (begin < sVar3) {
      local_68 = vector<duckdb::FrameBounds,_true>::operator[]
                           ((vector<duckdb::FrameBounds,_true> *)
                            CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                            in_stack_ffffffffffffff58);
      in_stack_ffffffffffffff67 = false;
      if (local_68->start <= local_50) {
        in_stack_ffffffffffffff67 = local_50 < local_68->end;
      }
      local_51 = (bool)(local_51 | in_stack_ffffffffffffff67 << 1);
    }
    in_stack_ffffffffffffff58 = (ulong)local_51;
    switch(in_stack_ffffffffffffff58) {
    case 0:
      local_70 = MinValue<unsigned_long>(local_68->start,pvVar2->start);
      ModeFunction<duckdb::ModeStandard<duckdb::interval_t>_>::
      UpdateWindowState<duckdb::ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>,_duckdb::interval_t>
      ::Neither(local_18,local_50,local_70);
      break;
    case 1:
      local_70 = MinValue<unsigned_long>(pvVar2->end,local_68->start);
      ModeFunction<duckdb::ModeStandard<duckdb::interval_t>_>::
      UpdateWindowState<duckdb::ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>,_duckdb::interval_t>
      ::Left((UpdateWindowState<duckdb::ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>,_duckdb::interval_t>
              *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),begin,
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      break;
    case 2:
      local_70 = MinValue<unsigned_long>(local_68->end,pvVar2->start);
      ModeFunction<duckdb::ModeStandard<duckdb::interval_t>_>::
      UpdateWindowState<duckdb::ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>,_duckdb::interval_t>
      ::Right((UpdateWindowState<duckdb::ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>,_duckdb::interval_t>
               *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),begin,
              CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      break;
    case 3:
    default:
      local_70 = MinValue<unsigned_long>(local_68->end,pvVar2->end);
      ModeFunction<duckdb::ModeStandard<duckdb::interval_t>_>::
      UpdateWindowState<duckdb::ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>,_duckdb::interval_t>
      ::Both(local_18,local_50,local_70);
    }
    local_50 = local_70;
    local_40 = (local_70 == pvVar2->end) + local_40;
    local_48 = (local_70 == local_68->end) + local_48;
  } while( true );
}

Assistant:

static void IntersectFrames(const SubFrames &lefts, const SubFrames &rights, OP &op) {
		const auto cover_start = MinValue(rights[0].start, lefts[0].start);
		const auto cover_end = MaxValue(rights.back().end, lefts.back().end);
		const FrameBounds last(cover_end, cover_end);

		//	Subframe indices
		idx_t l = 0;
		idx_t r = 0;
		for (auto i = cover_start; i < cover_end;) {
			uint8_t overlap = 0;

			// Are we in the previous frame?
			auto left = &last;
			if (l < lefts.size()) {
				left = &lefts[l];
				overlap |= uint8_t(left->start <= i && i < left->end) << 0;
			}

			// Are we in the current frame?
			auto right = &last;
			if (r < rights.size()) {
				right = &rights[r];
				overlap |= uint8_t(right->start <= i && i < right->end) << 1;
			}

			auto limit = i;
			switch (overlap) {
			case 0x00:
				// i ∉ F U P
				limit = MinValue(right->start, left->start);
				op.Neither(i, limit);
				break;
			case 0x01:
				// i ∈ P \ F
				limit = MinValue(left->end, right->start);
				op.Left(i, limit);
				break;
			case 0x02:
				// i ∈ F \ P
				limit = MinValue(right->end, left->start);
				op.Right(i, limit);
				break;
			case 0x03:
			default:
				D_ASSERT(overlap == 0x03);
				// i ∈ F ∩ P
				limit = MinValue(right->end, left->end);
				op.Both(i, limit);
				break;
			}

			// Advance  the subframe indices
			i = limit;
			l += (i == left->end);
			r += (i == right->end);
		}
	}